

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint encodeLZ77(uivector *out,Hash *hash,uchar *in,size_t inpos,size_t insize,uint windowsize,
               uint minmatch,uint nicematch,uint lazymatching)

{
  ushort *puVar1;
  uchar *puVar2;
  ushort uVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  size_t sVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  uchar *puVar20;
  uchar *puVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  ulong wpos;
  uint local_98;
  uint local_6c;
  uchar *puVar21;
  
  uVar24 = windowsize >> 3;
  if (0x1fff < windowsize) {
    uVar24 = windowsize;
  }
  uVar10 = 0x40;
  if (0x1fff < windowsize) {
    uVar10 = 0x102;
  }
  if (windowsize - 0x8001 < 0xffff8000) {
    uVar24 = 0x3c;
  }
  else if ((windowsize - 1 & windowsize) == 0) {
    uVar6 = 0;
    local_6c = 0;
    uVar11 = 0x102;
    if (nicematch < 0x102) {
      uVar11 = nicematch;
    }
    uVar25 = 0;
    bVar4 = false;
    for (; inpos < insize; inpos = inpos + 1) {
      uVar7 = getHash(in,insize,inpos);
      uVar13 = 0;
      local_98 = 0;
      if (uVar7 == 0) {
        if (uVar25 == 0) {
          uVar25 = countZeros(in,insize,inpos);
          uVar13 = (ulong)uVar25;
        }
        else {
          if ((insize < uVar25 + inpos) || (in[(uVar25 + inpos) - 1] != '\0')) {
            uVar25 = uVar25 - 1;
          }
          uVar13 = (ulong)uVar25;
        }
      }
      uVar25 = (uint)uVar13;
      wpos = (ulong)((uint)inpos & windowsize - 1);
      updateHashChain(hash,wpos,uVar7,(unsigned_short)uVar13);
      puVar2 = in + inpos;
      uVar12 = inpos + 0x102;
      if (insize <= inpos + 0x102) {
        uVar12 = insize;
      }
      uVar19 = 0;
      uVar14 = 0;
      uVar23 = 0;
      uVar15 = (ulong)hash->chain[wpos];
      do {
        while( true ) {
          if (uVar14 == uVar24) goto LAB_004deb0c;
          uVar17 = 0;
          if (wpos < uVar15) {
            uVar17 = (ulong)windowsize;
          }
          uVar17 = (wpos - uVar15) + uVar17;
          uVar16 = (uint)uVar17;
          if (uVar16 < (uint)uVar19) goto LAB_004deb0c;
          if (uVar17 != 0) {
            puVar22 = in + (inpos - (uVar17 & 0xffffffff));
            puVar20 = puVar2;
            if (2 < uVar25) {
              uVar19 = (ulong)(uint)hash->zeros[uVar15];
              if (uVar25 < hash->zeros[uVar15]) {
                uVar19 = uVar13;
              }
              puVar22 = puVar22 + uVar19;
              puVar20 = puVar2 + uVar19;
            }
            for (; (puVar21 = in + uVar12, puVar20 != in + uVar12 &&
                   (puVar21 = puVar20, *puVar22 == *puVar20)); puVar22 = puVar22 + 1) {
              puVar20 = puVar20 + 1;
            }
            uVar18 = (int)puVar21 - (int)puVar2;
            if ((uVar23 < uVar18) && (uVar23 = uVar18, local_98 = uVar16, uVar11 <= uVar18))
            goto LAB_004deb0c;
          }
          uVar3 = hash->chain[uVar15];
          if ((ushort)uVar15 == uVar3) goto LAB_004deb0c;
          uVar14 = uVar14 + 1;
          if ((2 < uVar25) && (uVar25 < uVar23)) break;
          uVar19 = uVar17 & 0xffffffff;
          uVar15 = (ulong)uVar3;
          if (hash->val[uVar3] != uVar7) goto LAB_004deb0c;
        }
        puVar1 = hash->chainz + uVar15;
        uVar19 = uVar17 & 0xffffffff;
        uVar15 = (ulong)*puVar1;
      } while (uVar25 == hash->zeros[*puVar1]);
LAB_004deb0c:
      bVar5 = bVar4;
      if (lazymatching == 0) {
LAB_004debcf:
        if ((2 < uVar23) && (windowsize < local_98)) {
          return 0x56;
        }
        bVar4 = bVar5;
        if (((uVar23 < 3) || (uVar23 < minmatch)) || ((uVar23 == 3 && (0x1000 < local_98)))) {
          uVar7 = uivector_push_back(out,(uint)in[inpos]);
          if (uVar7 == 0) {
            return 0x53;
          }
        }
        else {
          sVar8 = searchCodeIndex(LENGTHBASE,0x1d,(ulong)uVar23);
          uVar25 = LENGTHBASE[sVar8 & 0xffffffff];
          sVar9 = searchCodeIndex(DISTANCEBASE,0x1e,(ulong)local_98);
          uVar7 = DISTANCEBASE[sVar9 & 0xffffffff];
          uivector_push_back(out,(int)sVar8 + 0x101);
          uivector_push_back(out,uVar23 - uVar25);
          uivector_push_back(out,(uint)sVar9);
          uivector_push_back(out,local_98 - uVar7);
          while( true ) {
            uVar23 = uVar23 - 1;
            sVar8 = inpos + 1;
            uVar25 = (uint)uVar13;
            if (uVar23 == 0) break;
            uVar14 = getHash(in,insize,sVar8);
            uVar7 = 0;
            if (uVar14 == 0) {
              if (uVar25 == 0) {
                uVar7 = countZeros(in,insize,sVar8);
              }
              else if ((insize < sVar8 + uVar13) || (uVar7 = uVar25, in[inpos + uVar13] != '\0')) {
                uVar7 = uVar25 - 1;
              }
            }
            updateHashChain(hash,(ulong)((uint)sVar8 & windowsize - 1),uVar14,(unsigned_short)uVar7)
            ;
            uVar13 = (ulong)uVar7;
            inpos = sVar8;
          }
        }
      }
      else {
        if ((bVar4) || (uVar23 < 3)) {
          bVar5 = false;
          if (bVar4) {
            if (inpos == 0) {
              return 0x51;
            }
            if (uVar6 + 1 < uVar23) {
              uVar7 = uivector_push_back(out,(uint)in[inpos - 1]);
              bVar5 = false;
              if (uVar7 == 0) {
                return 0x53;
              }
            }
            else {
              inpos = inpos - 1;
              hash->head[uVar7] = -1;
              hash->headz[uVar13] = -1;
              local_98 = local_6c;
              uVar23 = uVar6;
            }
          }
          goto LAB_004debcf;
        }
        bVar5 = false;
        if (uVar10 < uVar23 || 0x101 < uVar23) goto LAB_004debcf;
        local_6c = local_98;
        bVar4 = true;
        uVar6 = uVar23;
      }
    }
    uVar24 = 0;
  }
  else {
    uVar24 = 0x5a;
  }
  return uVar24;
}

Assistant:

static unsigned encodeLZ77(uivector* out, Hash* hash,
                           const unsigned char* in, size_t inpos, size_t insize, unsigned windowsize,
                           unsigned minmatch, unsigned nicematch, unsigned lazymatching)
{
  size_t pos;
  unsigned i, error = 0;
  /*for large window lengths, assume the user wants no compression loss. Otherwise, max hash chain length speedup.*/
  unsigned maxchainlength = windowsize >= 8192 ? windowsize : windowsize / 8;
  unsigned maxlazymatch = windowsize >= 8192 ? MAX_SUPPORTED_DEFLATE_LENGTH : 64;

  unsigned usezeros = 1; /*not sure if setting it to false for windowsize < 8192 is better or worse*/
  unsigned numzeros = 0;

  unsigned offset; /*the offset represents the distance in LZ77 terminology*/
  unsigned length;
  unsigned lazy = 0;
  unsigned lazylength = 0, lazyoffset = 0;
  unsigned hashval;
  unsigned current_offset, current_length;
  unsigned prev_offset;
  const unsigned char *lastptr, *foreptr, *backptr;
  unsigned hashpos;

  if(windowsize == 0 || windowsize > 32768) return 60; /*error: windowsize smaller/larger than allowed*/
  if((windowsize & (windowsize - 1)) != 0) return 90; /*error: must be power of two*/

  if(nicematch > MAX_SUPPORTED_DEFLATE_LENGTH) nicematch = MAX_SUPPORTED_DEFLATE_LENGTH;

  for(pos = inpos; pos < insize; ++pos)
  {
    size_t wpos = pos & (windowsize - 1); /*position for in 'circular' hash buffers*/
    unsigned chainlength = 0;

    hashval = getHash(in, insize, pos);

    if(usezeros && hashval == 0)
    {
      if(numzeros == 0) numzeros = countZeros(in, insize, pos);
      else if(pos + numzeros > insize || in[pos + numzeros - 1] != 0) --numzeros;
    }
    else
    {
      numzeros = 0;
    }

    updateHashChain(hash, wpos, hashval, numzeros);

    /*the length and offset found for the current position*/
    length = 0;
    offset = 0;

    hashpos = hash->chain[wpos];

    lastptr = &in[insize < pos + MAX_SUPPORTED_DEFLATE_LENGTH ? insize : pos + MAX_SUPPORTED_DEFLATE_LENGTH];

    /*search for the longest string*/
    prev_offset = 0;
    for(;;)
    {
      if(chainlength++ >= maxchainlength) break;
      current_offset = hashpos <= wpos ? wpos - hashpos : wpos - hashpos + windowsize;

      if(current_offset < prev_offset) break; /*stop when went completely around the circular buffer*/
      prev_offset = current_offset;
      if(current_offset > 0)
      {
        /*test the next characters*/
        foreptr = &in[pos];
        backptr = &in[pos - current_offset];

        /*common case in PNGs is lots of zeros. Quickly skip over them as a speedup*/
        if(numzeros >= 3)
        {
          unsigned skip = hash->zeros[hashpos];
          if(skip > numzeros) skip = numzeros;
          backptr += skip;
          foreptr += skip;
        }

        while(foreptr != lastptr && *backptr == *foreptr) /*maximum supported length by deflate is max length*/
        {
          ++backptr;
          ++foreptr;
        }
        current_length = (unsigned)(foreptr - &in[pos]);

        if(current_length > length)
        {
          length = current_length; /*the longest length*/
          offset = current_offset; /*the offset that is related to this longest length*/
          /*jump out once a length of max length is found (speed gain). This also jumps
          out if length is MAX_SUPPORTED_DEFLATE_LENGTH*/
          if(current_length >= nicematch) break;
        }
      }

      if(hashpos == hash->chain[hashpos]) break;

      if(numzeros >= 3 && length > numzeros)
      {
        hashpos = hash->chainz[hashpos];
        if(hash->zeros[hashpos] != numzeros) break;
      }
      else
      {
        hashpos = hash->chain[hashpos];
        /*outdated hash value, happens if particular value was not encountered in whole last window*/
        if(hash->val[hashpos] != (int)hashval) break;
      }
    }

    if(lazymatching)
    {
      if(!lazy && length >= 3 && length <= maxlazymatch && length < MAX_SUPPORTED_DEFLATE_LENGTH)
      {
        lazy = 1;
        lazylength = length;
        lazyoffset = offset;
        continue; /*try the next byte*/
      }
      if(lazy)
      {
        lazy = 0;
        if(pos == 0) ERROR_BREAK(81);
        if(length > lazylength + 1)
        {
          /*push the previous character as literal*/
          if(!uivector_push_back(out, in[pos - 1])) ERROR_BREAK(83 /*alloc fail*/);
        }
        else
        {
          length = lazylength;
          offset = lazyoffset;
          hash->head[hashval] = -1; /*the same hashchain update will be done, this ensures no wrong alteration*/
          hash->headz[numzeros] = -1; /*idem*/
          --pos;
        }
      }
    }
    if(length >= 3 && offset > windowsize) ERROR_BREAK(86 /*too big (or overflown negative) offset*/);

    /*encode it as length/distance pair or literal value*/
    if(length < 3) /*only lengths of 3 or higher are supported as length/distance pair*/
    {
      if(!uivector_push_back(out, in[pos])) ERROR_BREAK(83 /*alloc fail*/);
    }
    else if(length < minmatch || (length == 3 && offset > 4096))
    {
      /*compensate for the fact that longer offsets have more extra bits, a
      length of only 3 may be not worth it then*/
      if(!uivector_push_back(out, in[pos])) ERROR_BREAK(83 /*alloc fail*/);
    }
    else
    {
      addLengthDistance(out, length, offset);
      for(i = 1; i < length; ++i)
      {
        ++pos;
        wpos = pos & (windowsize - 1);
        hashval = getHash(in, insize, pos);
        if(usezeros && hashval == 0)
        {
          if(numzeros == 0) numzeros = countZeros(in, insize, pos);
          else if(pos + numzeros > insize || in[pos + numzeros - 1] != 0) --numzeros;
        }
        else
        {
          numzeros = 0;
        }
        updateHashChain(hash, wpos, hashval, numzeros);
      }
    }
  } /*end of the loop through each character of input*/

  return error;
}